

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GLSL420Pack::GLSLTestBase::testCompute(GLSLTestBase *this)

{
  byte bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  RenderContext *pRVar3;
  undefined4 extraout_var_00;
  Functions *gl;
  GLchar *sampler_name;
  MessageBuilder message;
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  shaderSource local_130;
  shaderSource local_110;
  shaderSource local_f0;
  shaderSource local_d0;
  undefined4 local_ac;
  undefined1 local_a8 [8];
  shaderSource compute_shader;
  texture source_tex;
  undefined1 local_60 [8];
  program program;
  texture color_tex;
  bool result;
  GLSLTestBase *this_local;
  
  Utils::texture::texture
            ((texture *)&program.m_context,(this->super_TestBase).super_TestCase.m_context);
  Utils::program::program((program *)local_60,(this->super_TestBase).super_TestCase.m_context);
  Utils::texture::texture
            ((texture *)&compute_shader.m_use_lengths,
             (this->super_TestBase).super_TestCase.m_context);
  Utils::shaderSource::shaderSource((shaderSource *)local_a8);
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,(shaderSource *)local_a8);
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::operator[]((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                *)local_a8,0);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    this_local._7_1_ = true;
  }
  else {
    Utils::shaderSource::shaderSource(&local_d0,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_f0,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_110,(GLchar *)0x0);
    Utils::shaderSource::shaderSource(&local_130,(GLchar *)0x0);
    Utils::shaderSource::shaderSource((shaderSource *)&exc_1,(GLchar *)0x0);
    Utils::program::build
              ((program *)local_60,(shaderSource *)local_a8,&local_d0,&local_f0,&local_110,
               &local_130,(shaderSource *)&exc_1,(GLchar **)0x0,0,false);
    Utils::shaderSource::~shaderSource((shaderSource *)&exc_1);
    Utils::shaderSource::~shaderSource(&local_130);
    Utils::shaderSource::~shaderSource(&local_110);
    Utils::shaderSource::~shaderSource(&local_f0);
    Utils::shaderSource::~shaderSource(&local_d0);
    Utils::program::use((program *)local_60);
    prepareImage(this,(program *)local_60,(texture *)&program.m_context);
    iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0xc])(this,&compute_shader.m_use_lengths);
    if ((GLchar *)CONCAT44(extraout_var,iVar2) != (GLchar *)0x0) {
      bindTextureToSampler
                (this,(program *)local_60,(texture *)&compute_shader.m_use_lengths,
                 (GLchar *)CONCAT44(extraout_var,iVar2));
    }
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,local_60);
    pRVar3 = deqp::Context::getRenderContext((this->super_TestBase).super_TestCase.m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x528))(0x10,0x10,1);
    err = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    glu::checkError(err,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x828);
    this_local._7_1_ = checkResults(this,(texture *)&program.m_context);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])();
  }
  local_ac = 1;
  Utils::shaderSource::~shaderSource((shaderSource *)local_a8);
  Utils::texture::~texture((texture *)&compute_shader.m_use_lengths);
  Utils::program::~program((program *)local_60);
  Utils::texture::~texture((texture *)&program.m_context);
  return this_local._7_1_;
}

Assistant:

bool GLSLTestBase::testCompute()
{
	/* Test Result */
	bool result = true;

	/* GL objects */
	Utils::texture color_tex(m_context);
	Utils::program program(m_context);
	Utils::texture source_tex(m_context);

	/* Shaders */
	Utils::shaderSource compute_shader;
	initShaderSource(Utils::COMPUTE_SHADER, false, compute_shader);

	/* Check if test support compute shaders */
	if (true == compute_shader.m_parts[0].m_code.empty())
	{
		return true;
	}

	/* Build program */
	try
	{
		program.build(compute_shader, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

/* Log shaders, for debugging */
#if IS_DEBUG
	{
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		Utils::program::printShaderSource(compute_shader, message);

		message << tcu::TestLog::EndMessage;
	}
#endif /* IS_DEBUG */

	/* Set current program */
	program.use();

	/* Prepare image unit */
	prepareImage(program, color_tex);

	/* Test specific preparation of source texture */
	const GLchar* sampler_name = prepareSourceTexture(source_tex);
	if (0 != sampler_name)
	{
		bindTextureToSampler(program, source_tex, sampler_name);
	}

	/* Set up uniforms */
	prepareUniforms(program);

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Draw */
	gl.dispatchCompute(m_color_texture_width, m_color_texture_height, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

	/* Return result of verification */
	result = checkResults(color_tex);

	/* Release extra resource for the test */
	releaseResource();

	return result;
}